

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimCriticalPath(Sfm_Tim_t *p,int Window)

{
  Abc_Ntk_t *pAVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  int SlackMax;
  int iVar5;
  
  SlackMax = (Window * p->Delay) / 100;
  (p->vPath).nSize = 0;
  pAVar1 = p->pNtk;
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    Vec_IntFill(&pAVar1->vTravIds,pAVar1->vObjs->nSize + 500,0);
  }
  iVar5 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar5 + 1;
  if (iVar5 < 0x3fffffff) {
    iVar5 = 0;
    do {
      if (p->pNtk->vCos->nSize <= iVar5) {
        return (p->vPath).nSize;
      }
      pAVar4 = Abc_NtkCo(p->pNtk,iVar5);
      pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf;
      if (((uVar2 != 2) && (uVar2 != 5)) && ((pAVar4->vFanins).nSize != 0)) {
        if (uVar2 != 7) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                        ,0xb7,"int Sfm_TimCriticalPath(Sfm_Tim_t *, int)");
        }
        iVar3 = Sfm_TimSlack(p,pAVar4);
        if (iVar3 <= SlackMax) {
          Sfm_TimCriticalPath_int(p,pAVar4,&p->vPath,SlackMax);
        }
      }
      iVar5 = iVar5 + 1;
    } while( true );
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Sfm_TimCriticalPath( Sfm_Tim_t * p, int Window )
{
    int i, SlackMax = p->Delay * Window / 100;
    Abc_Obj_t * pObj, * pNext; 
    Vec_IntClear( &p->vPath );
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        pNext = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, &p->vPath, SlackMax );
    }
    return Vec_IntSize(&p->vPath);
}